

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

int __thiscall
cmExtraCodeBlocksGenerator::GetCBTargetType
          (cmExtraCodeBlocksGenerator *this,cmGeneratorTarget *target)

{
  bool bVar1;
  TargetType TVar2;
  uint uVar3;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  TVar2 = cmGeneratorTarget::GetType(target);
  if (TVar2 == EXECUTABLE) {
    std::__cxx11::string::string((string *)&local_38,"WIN32_EXECUTABLE",&local_59);
    bVar1 = cmGeneratorTarget::GetPropertyAsBool(target,&local_38);
    uVar3 = 0;
    if (!bVar1) {
      std::__cxx11::string::string((string *)&local_58,"MACOSX_BUNDLE",&local_5a);
      bVar1 = cmGeneratorTarget::GetPropertyAsBool(target,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      uVar3 = (uint)!bVar1;
    }
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    TVar2 = cmGeneratorTarget::GetType(target);
    uVar3 = 2;
    if (TVar2 != STATIC_LIBRARY) {
      TVar2 = cmGeneratorTarget::GetType(target);
      if (TVar2 != OBJECT_LIBRARY) {
        TVar2 = cmGeneratorTarget::GetType(target);
        if (TVar2 == SHARED_LIBRARY) {
          uVar3 = 3;
        }
        else {
          TVar2 = cmGeneratorTarget::GetType(target);
          uVar3 = (TVar2 != MODULE_LIBRARY) + 3;
        }
      }
    }
  }
  return uVar3;
}

Assistant:

int cmExtraCodeBlocksGenerator::GetCBTargetType(cmGeneratorTarget* target)
{
  if ( target->GetType()==cmState::EXECUTABLE)
    {
    if ((target->GetPropertyAsBool("WIN32_EXECUTABLE"))
        || (target->GetPropertyAsBool("MACOSX_BUNDLE")))
      {
      return 0;
      }
    else
      {
      return 1;
      }
    }
  else if (( target->GetType()==cmState::STATIC_LIBRARY)
        || (target->GetType()==cmState::OBJECT_LIBRARY))
    {
    return 2;
    }
  else if ((target->GetType()==cmState::SHARED_LIBRARY)
           || (target->GetType()==cmState::MODULE_LIBRARY))
    {
    return 3;
    }
  return 4;
}